

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_recv_cack(udp_ep *ep,udp_sp_creq *cack,nng_sockaddr *sa)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  int iVar4;
  udp_pipe *p;
  nni_time nVar5;
  udp_disc_reason reason;
  udp_sp_msg local_44;
  
  uVar2 = cack->us_sender_id;
  p = (udp_pipe *)nni_id_get(&ep->pipes,(ulong)cack->us_peer_id);
  if (((p == (udp_pipe *)0x0) || (p->closed != false)) ||
     ((p->peer_id != 0 && (p->peer_id != uVar2)))) {
    p = (udp_pipe *)0x0;
  }
  if ((p != (udp_pipe *)0x0) && (p->closed == false)) {
    uVar2 = p->peer_id;
    if ((uVar2 == 0) || (p->peer == cack->us_type)) {
      p->sndmax = cack->us_recv_max;
      p->peer = cack->us_type;
      p->peer_id = cack->us_sender_id;
      bVar1 = cack->us_refresh;
      if (bVar1 != 0) {
        if (uVar2 == 0) {
          p->refresh = ep->refresh;
          p->peer_seq = cack->us_sequence + 1;
        }
        iVar4 = (uint)bVar1 * 1000;
        if (iVar4 < p->refresh) {
          p->refresh = iVar4;
        }
        nVar5 = nni_clock();
        p->next_wake = nVar5 + (long)p->refresh;
        p->expire = (long)p->refresh * 5 + nVar5;
        udp_pipe_schedule(p);
        if (uVar2 != 0) {
          return;
        }
        nni_list_append(&ep->connpipes,p);
        udp_ep_match(ep);
        return;
      }
      reason = DISC_NEGO;
    }
    else {
      reason = DISC_TYPE;
    }
    udp_send_disc(ep,p,reason);
    return;
  }
  uVar3._0_4_ = cack->us_sender_id;
  uVar3._4_4_ = cack->us_peer_id;
  local_44._4_8_ = uVar3 << 0x20 | uVar3 >> 0x20;
  local_44._0_2_ = 0x301;
  local_44.data.us_type = ep->proto;
  local_44.data.us_sequence = 0;
  local_44.data.us_length = 2;
  udp_queue_tx(ep,sa,&local_44,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_recv_cack(udp_ep *ep, udp_sp_creq *cack, nng_sockaddr *sa)
{
	udp_pipe *p;
	bool      first;
	nni_time  now;

	if ((p = udp_find_pipe(ep, cack->us_peer_id, cack->us_sender_id)) &&
	    (!p->closed)) {
		if ((p->peer_id != 0) && (p->peer != cack->us_type)) {
			udp_send_disc(ep, p, DISC_TYPE);
			return;
		}

		first = (p->peer_id == 0);

		// so we know who it is from.. this is a refresh.
		p->sndmax  = cack->us_recv_max;
		p->peer    = cack->us_type;
		p->peer_id = cack->us_sender_id;

		if (cack->us_refresh == 0) {
			udp_send_disc(ep, p, DISC_NEGO);
			return;
		}
		if (first) {
			p->refresh  = ep->refresh;
			p->peer_seq = cack->us_sequence + 1;
		}
		if ((cack->us_refresh * NNI_SECOND) < p->refresh) {
			p->refresh = cack->us_refresh * NNI_SECOND;
		}
		now          = nni_clock();
		p->next_wake = now + UDP_PIPE_REFRESH(p);
		p->expire    = now + UDP_PIPE_TIMEOUT(p);
		udp_pipe_schedule(p);

		if (first) {
			nni_list_append(&ep->connpipes, p);
			udp_ep_match(ep);
		}
		return;
	}

	// a CACK without a corresponding CREQ (or timed out pipe already)
	udp_send_disc_full(
	    ep, sa, cack->us_peer_id, cack->us_sender_id, 0, DISC_NOTCONN);
}